

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble * trng::math::detail::GammaP_ser<long_double,true>(longdouble a,longdouble x)

{
  longdouble *plVar1;
  longdouble *extraout_RAX;
  int in_EDI;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar2;
  longdouble in_ST5;
  longdouble lVar3;
  double __x;
  unkbyte10 in_stack_00000008;
  longdouble in_stack_00000018;
  int i;
  longdouble sum;
  longdouble n;
  longdouble xx;
  longdouble eps;
  int itmax;
  undefined8 in_stack_ffffffffffffff32;
  bool local_8d;
  int local_8c;
  
  lVar2 = in_ST5;
  plVar1 = std::numeric_limits<long_double>::epsilon();
  if ((longdouble)4.3368087e-19 <= in_stack_00000018) {
    local_8c = 0;
    do {
      local_8c = local_8c + 1;
      lVar3 = lVar2;
      std::abs(in_EDI);
      std::abs(in_EDI);
      local_8d = (longdouble)4.3368087e-19 * in_ST2 < in_ST1 && local_8c < 0x40;
      in_ST1 = in_ST3;
      in_ST2 = in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = lVar2;
      in_ST5 = lVar3;
      lVar2 = lVar3;
    } while (local_8d);
    ln((longdouble)CONCAT82(in_stack_ffffffffffffff32,(short)((unkuint10)in_stack_00000018 >> 0x40))
      );
    ln_Gamma((longdouble)
             CONCAT82(in_stack_ffffffffffffff32,(short)((unkuint10)in_stack_00000008 >> 0x40)));
    std::exp(__x);
    plVar1 = extraout_RAX;
  }
  return plVar1;
}

Assistant:

TRNG_CUDA_ENABLE T GammaP_ser(T a, T x) {
        const int itmax{numeric_limits<T>::digits};
        const T eps{4 * numeric_limits<T>::epsilon()};
        if (x < eps)
          return T{0};
        T xx{1 / a}, n{a}, sum{xx};
        int i{0};
        do {
          ++n;
          ++i;
          xx *= x / n;
          sum += xx;
        } while (abs(xx) > eps * abs(sum) and i < itmax);
#if __cplusplus >= 201703L
        if constexpr (by_Gamma_a)
#else
        if (by_Gamma_a)
#endif
          return exp(-x + a * ln(x) - ln_Gamma(a)) * sum;
        else
          return exp(-x + a * ln(x)) * sum;
      }